

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

raw_problem_status parse(context *ctx,stream_buffer *buf,problem_parser *p)

{
  string_view *psVar1;
  size_t sVar2;
  string_view token;
  string_view first;
  string_view str;
  string_view buf_1;
  string_view buf_1_00;
  string_view buf_1_01;
  string_view str_00;
  string_view str_01;
  string_view buf_1_02;
  string_view buf_1_03;
  string_view buf_1_04;
  string_view buf_1_05;
  string_view buf_1_06;
  string_view str_02;
  string_view buf_1_07;
  string_view str_03;
  string_view value_00;
  string_view buf_1_08;
  string_view str_04;
  string_view value_01;
  string_view buf_1_09;
  bound_token bound;
  string_view value_02;
  string_view value_03;
  bool bVar3;
  int iVar4;
  optional<baryonyx::objective_function_type> oVar5;
  pointer pfVar6;
  long lVar7;
  long lVar8;
  pointer pfVar9;
  char cVar10;
  uint uVar11;
  ulong uVar12;
  double sign_factor;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  raw_problem_status rVar13;
  optional<operator_token> oVar14;
  raw_problem_status rVar15;
  string_view str_05;
  ulong uStackY_1c0;
  uint local_188;
  int value;
  int local_180;
  int local_17c;
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> elements;
  undefined8 uStack_160;
  undefined4 local_158;
  undefined4 uStack_154;
  bool local_150;
  string_view local_148;
  optional<real_token> value_opt;
  optional<function_element_token> elem;
  
  token._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
  token._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
  oVar5 = read_objective_type(token);
  if (((ulong)oVar5.super__Optional_base<baryonyx::objective_function_type,_true,_true>._M_payload.
              super__Optional_payload_base<baryonyx::objective_function_type> >> 0x20 & 1) != 0) {
    (p->m_problem).type =
         oVar5.super__Optional_base<baryonyx::objective_function_type,_true,_true>._M_payload.
         super__Optional_payload_base<baryonyx::objective_function_type>._M_payload;
    stream_buffer::pop_front(buf);
    first._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
    first._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
    iVar4 = try_read_objective_label(first,(buf->buffer_ptr)._M_elems[1]);
    if (iVar4 != 0) {
      stream_buffer::pop_front(buf,iVar4);
    }
    uVar12 = 0;
    uStackY_1c0 = 5;
    local_188 = 0;
    do {
      while( true ) {
        str._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
        str._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
        bVar3 = is_keyword(str);
        buf_1_01._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
        buf_1_01._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
        buf_1._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
        buf_1._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
        psVar1 = (buf->buffer_ptr)._M_elems + 1;
        if (bVar3) {
          iVar4 = read_subject_to(buf_1_01,*psVar1,(buf->buffer_ptr)._M_elems[2]);
          if (iVar4 == 0) goto LAB_00124c9b;
          stream_buffer::pop_front(buf,iVar4);
          local_180 = 0;
          goto LAB_0012477b;
        }
        bVar3 = starts_with_quadratic(buf_1,*psVar1);
        if (bVar3) break;
        buf_1_00._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
        buf_1_00._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
        read_function_element
                  (&elem,buf_1_00,(buf->buffer_ptr)._M_elems[1],(buf->buffer_ptr)._M_elems[2]);
        if (elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
            super__Optional_payload_base<function_element_token>._M_engaged != true) {
          uStackY_1c0 = 6;
          goto LAB_00124e54;
        }
        bVar3 = problem_parser::append_to_objective(p,(function_element_token *)&elem);
        if (!bVar3) {
          uStackY_1c0 = 0xb;
          goto LAB_00124e54;
        }
        stream_buffer::pop_front
                  (buf,elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
                       super__Optional_payload_base<function_element_token>._M_payload._M_value.read
                  );
      }
      __y._M_str = "-";
      __y._M_len = 1;
      bVar3 = std::operator==((buf->buffer_ptr)._M_elems[0],__y);
      if (bVar3) {
        stream_buffer::pop_front(buf);
        sign_factor = -1.0;
      }
      else {
        __y_00._M_str = "+";
        __y_00._M_len = 1;
        bVar3 = std::operator==((buf->buffer_ptr)._M_elems[0],__y_00);
        sign_factor = 1.0;
        if (bVar3) {
          stream_buffer::pop_front(buf);
          sign_factor = 1.0;
        }
      }
      rVar13 = read_quadratic_element(buf,p,sign_factor);
      local_188 = rVar13.column;
      uVar12 = rVar13._0_8_ >> 0x20;
      uStackY_1c0 = 0;
    } while (rVar13.tag == success);
    goto LAB_00124e5c;
  }
  uStackY_1c0 = 5;
  goto LAB_00124e54;
LAB_0012477b:
  do {
    uVar11 = (uint)uVar12;
    sVar2 = (buf->buffer_ptr)._M_elems[0]._M_len;
    if ((sVar2 == 0) ||
       (str_05._M_str = (buf->buffer_ptr)._M_elems[0]._M_str, str_05._M_len = sVar2,
       bVar3 = is_keyword(str_05), bVar3)) {
      if ((ulong)(((long)(p->m_problem).less_constraints.
                         super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(p->m_problem).less_constraints.
                        super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x30 +
                 ((long)(p->m_problem).greater_constraints.
                        super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(p->m_problem).greater_constraints.
                       super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x30 +
                 ((long)(p->m_problem).equal_constraints.
                        super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(p->m_problem).equal_constraints.
                       super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x30) < 0x80000000)
      goto LAB_00124c9b;
      uStackY_1c0 = 0xc;
      goto LAB_00124e54;
    }
    elements.
    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148 = (string_view)ZEXT816(0);
    elements.
    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    elements.
    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    str_00._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
    str_00._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
    bVar3 = starts_with_name(str_00);
    if ((bVar3) &&
       (__y_01._M_str = ":", __y_01._M_len = 1,
       bVar3 = std::operator==((buf->buffer_ptr)._M_elems[1],__y_01), bVar3)) {
      str_01._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
      str_01._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
      local_148 = baryonyx::string_buffer::append
                            ((p->m_problem).strings.
                             super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,str_01);
      stream_buffer::pop_front(buf,2);
    }
    buf_1_02._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
    buf_1_02._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
    read_function_element
              (&elem,buf_1_02,(buf->buffer_ptr)._M_elems[1],(buf->buffer_ptr)._M_elems[2]);
    if (elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
        super__Optional_payload_base<function_element_token>._M_engaged == true) {
      value_02._M_str =
           elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
           super__Optional_payload_base<function_element_token>._M_payload._M_value.name._M_str;
      value_02._M_len =
           elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
           super__Optional_payload_base<function_element_token>._M_payload._M_value.name._M_len;
      value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
      super__Optional_payload_base<real_token>._M_payload._0_4_ =
           problem_parser::get_or_assign_variable(p,value_02);
      if (value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
          super__Optional_payload_base<real_token>._M_payload._0_4_ == -1) {
LAB_00124a99:
        uStackY_1c0 = 0xb;
        goto LAB_00124b71;
      }
      lVar7 = (long)elements.
                    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)elements.
                    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      pfVar6 = elements.
               super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
               ._M_impl.super__Vector_impl_data._M_start + 2;
      for (lVar8 = lVar7 >> 5; 0 < lVar8; lVar8 = lVar8 + -1) {
        if (pfVar6[-2].variable_index ==
            value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
            super__Optional_payload_base<real_token>._M_payload._0_4_) {
          pfVar9 = pfVar6 + -2;
          goto LAB_001248ea;
        }
        if (pfVar6[-1].variable_index ==
            value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
            super__Optional_payload_base<real_token>._M_payload._0_4_) {
          pfVar9 = pfVar6 + -1;
          goto LAB_001248ea;
        }
        pfVar9 = pfVar6;
        if (pfVar6->variable_index ==
            value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
            super__Optional_payload_base<real_token>._M_payload._0_4_) goto LAB_001248ea;
        if (pfVar6[1].variable_index ==
            value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
            super__Optional_payload_base<real_token>._M_payload._0_4_) {
          pfVar9 = pfVar6 + 1;
          goto LAB_001248ea;
        }
        pfVar6 = pfVar6 + 4;
        lVar7 = lVar7 + -0x20;
      }
      lVar7 = lVar7 >> 3;
      pfVar9 = pfVar6 + -2;
      if (lVar7 == 1) {
LAB_00124bcc:
        if (pfVar9->variable_index !=
            value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
            super__Optional_payload_base<real_token>._M_payload._0_4_) {
          pfVar9 = elements.
                   super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
LAB_001248ea:
        if (pfVar9 == elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001248fc;
        pfVar9->factor =
             pfVar9->factor +
             (int)elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
                  super__Optional_payload_base<function_element_token>._M_payload._M_value.factor;
      }
      else {
        if (lVar7 == 3) {
          if (pfVar6[-2].variable_index !=
              value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
              super__Optional_payload_base<real_token>._M_payload._0_4_) {
            pfVar9 = pfVar6 + -1;
            goto LAB_00124bbf;
          }
          goto LAB_001248ea;
        }
        if (lVar7 == 2) {
LAB_00124bbf:
          if (pfVar9->variable_index !=
              value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
              super__Optional_payload_base<real_token>._M_payload._0_4_) {
            pfVar9 = pfVar9 + 1;
            goto LAB_00124bcc;
          }
          goto LAB_001248ea;
        }
LAB_001248fc:
        value = (int)elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
                     super__Optional_payload_base<function_element_token>._M_payload._M_value.factor
        ;
        std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>::
        emplace_back<int,int&>
                  ((vector<baryonyx::function_element,std::allocator<baryonyx::function_element>> *)
                   &elements,&value,(int *)&value_opt);
      }
      stream_buffer::pop_front
                (buf,elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
                     super__Optional_payload_base<function_element_token>._M_payload._M_value.read);
      while( true ) {
        buf_1_04._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
        buf_1_04._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
        buf_1_03._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
        buf_1_03._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
        if (((buf->buffer_ptr)._M_elems[0]._M_len == 0) ||
           ((byte)(*(buf->buffer_ptr)._M_elems[0]._M_str - 0x3cU) < 3)) break;
        read_function_element
                  (&elem,buf_1_03,(buf->buffer_ptr)._M_elems[1],(buf->buffer_ptr)._M_elems[2]);
        if (elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
            super__Optional_payload_base<function_element_token>._M_engaged != true)
        goto LAB_00124b6f;
        value_03._M_str =
             elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
             super__Optional_payload_base<function_element_token>._M_payload._M_value.name._M_str;
        value_03._M_len =
             elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
             super__Optional_payload_base<function_element_token>._M_payload._M_value.name._M_len;
        value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
        super__Optional_payload_base<real_token>._M_payload._0_4_ =
             problem_parser::get_or_assign_variable(p,value_03);
        if (value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
            super__Optional_payload_base<real_token>._M_payload._0_4_ == -1) goto LAB_00124a99;
        lVar7 = (long)elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        pfVar6 = elements.
                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                 ._M_impl.super__Vector_impl_data._M_start + 2;
        for (lVar8 = lVar7 >> 5; 0 < lVar8; lVar8 = lVar8 + -1) {
          if (pfVar6[-2].variable_index ==
              value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
              super__Optional_payload_base<real_token>._M_payload._0_4_) {
            pfVar9 = pfVar6 + -2;
            goto LAB_00124a26;
          }
          if (pfVar6[-1].variable_index ==
              value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
              super__Optional_payload_base<real_token>._M_payload._0_4_) {
            pfVar9 = pfVar6 + -1;
            goto LAB_00124a26;
          }
          pfVar9 = pfVar6;
          if (pfVar6->variable_index ==
              value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
              super__Optional_payload_base<real_token>._M_payload._0_4_) goto LAB_00124a26;
          if (pfVar6[1].variable_index ==
              value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
              super__Optional_payload_base<real_token>._M_payload._0_4_) {
            pfVar9 = pfVar6 + 1;
            goto LAB_00124a26;
          }
          pfVar6 = pfVar6 + 4;
          lVar7 = lVar7 + -0x20;
        }
        lVar7 = lVar7 >> 3;
        pfVar9 = pfVar6 + -2;
        if (lVar7 == 1) {
LAB_00124a90:
          if (pfVar9->variable_index !=
              value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
              super__Optional_payload_base<real_token>._M_payload._0_4_) {
            pfVar9 = elements.
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
LAB_00124a26:
          if (pfVar9 == elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00124a38;
          pfVar9->factor =
               pfVar9->factor +
               (int)elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
                    super__Optional_payload_base<function_element_token>._M_payload._M_value.factor;
        }
        else {
          if (lVar7 == 3) {
            if (pfVar6[-2].variable_index !=
                value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
                super__Optional_payload_base<real_token>._M_payload._0_4_) {
              pfVar9 = pfVar6 + -1;
              goto LAB_00124a87;
            }
            goto LAB_00124a26;
          }
          if (lVar7 == 2) {
LAB_00124a87:
            if (pfVar9->variable_index !=
                value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
                super__Optional_payload_base<real_token>._M_payload._0_4_) {
              pfVar9 = pfVar9 + 1;
              goto LAB_00124a90;
            }
            goto LAB_00124a26;
          }
LAB_00124a38:
          value = (int)elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
                       super__Optional_payload_base<function_element_token>._M_payload._M_value.
                       factor;
          std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>::
          emplace_back<int,int&>
                    ((vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>
                      *)&elements,&value,(int *)&value_opt);
        }
        if (elements.
            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].variable_index == -1) goto LAB_00124a99;
        stream_buffer::pop_front
                  (buf,elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
                       super__Optional_payload_base<function_element_token>._M_payload._M_value.read
                  );
      }
      oVar14 = read_operator(buf_1_04,(buf->buffer_ptr)._M_elems[1]);
      if (((undefined1  [12])
           oVar14.super__Optional_base<operator_token,_true,_true>._M_payload.
           super__Optional_payload_base<operator_token> & (undefined1  [12])0x1) ==
          (undefined1  [12])0x0) goto LAB_00124b6f;
      stream_buffer::pop_front
                (buf,oVar14.super__Optional_base<operator_token,_true,_true>._M_payload.
                     super__Optional_payload_base<operator_token>._M_payload._4_4_);
      buf_1_05._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
      buf_1_05._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
      read_real(&value_opt,buf_1_05,(buf->buffer_ptr)._M_elems[1]);
      cVar10 = value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
               super__Optional_payload_base<real_token>._M_engaged;
      if (value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
          super__Optional_payload_base<real_token>._M_engaged == true) {
        value = (int)(double)CONCAT44(value_opt.super__Optional_base<real_token,_true,_true>.
                                      _M_payload.super__Optional_payload_base<real_token>._M_payload
                                      ._4_4_,value_opt.super__Optional_base<real_token,_true,_true>.
                                             _M_payload.super__Optional_payload_base<real_token>.
                                             _M_payload._0_4_);
        stream_buffer::pop_front
                  (buf,value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
                       super__Optional_payload_base<real_token>._M_payload._M_value.read);
        iVar4 = oVar14.super__Optional_base<operator_token,_true,_true>._M_payload.
                super__Optional_payload_base<operator_token>._M_payload._0_4_;
        if (iVar4 == 2) {
          local_17c = local_180;
          std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>::
          emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,int&,int>
                    ((vector<baryonyx::constraint,std::allocator<baryonyx::constraint>> *)
                     &(p->m_problem).less_constraints,&local_148,&elements,&value,&local_17c);
        }
        else if (iVar4 == 1) {
          local_17c = local_180;
          std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>::
          emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,int&,int>
                    ((vector<baryonyx::constraint,std::allocator<baryonyx::constraint>> *)
                     &(p->m_problem).greater_constraints,&local_148,&elements,&value,&local_17c);
        }
        else {
          if (iVar4 != 0) goto LAB_00124c30;
          local_17c = local_180;
          std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>::
          emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,int&,int>
                    ((vector<baryonyx::constraint,std::allocator<baryonyx::constraint>> *)
                     &(p->m_problem).equal_constraints,&local_148,&elements,&value,&local_17c);
        }
        local_180 = local_180 + 1;
      }
      else {
        uStackY_1c0 = 10;
        uVar11 = 0;
        local_188 = 0;
      }
LAB_00124c30:
      uVar12 = (ulong)uVar11;
    }
    else {
LAB_00124b6f:
      uStackY_1c0 = 10;
LAB_00124b71:
      uVar12 = 0;
      local_188 = 0;
      cVar10 = '\0';
    }
    rVar13.column = local_188;
    rVar13.tag = (int)uStackY_1c0;
    rVar13.line = (int)(uStackY_1c0 >> 0x20);
    std::_Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
    ~_Vector_base(&elements.
                   super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                 );
  } while (cVar10 != '\0');
  goto LAB_00124e5c;
LAB_00124c9b:
  buf_1_06._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
  buf_1_06._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
  iVar4 = read_bounds(buf_1_06,(buf->buffer_ptr)._M_elems[1]);
  if (iVar4 != 0) {
    stream_buffer::pop_front(buf,iVar4);
    while (str_02._M_len = (buf->buffer_ptr)._M_elems[0]._M_len,
          str_02._M_str = (buf->buffer_ptr)._M_elems[0]._M_str, bVar3 = is_keyword(str_02), !bVar3)
    {
      elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
      super__Optional_payload_base<function_element_token>._M_payload._M_value.factor =
           (double)(buf->buffer_ptr)._M_elems[0]._M_len;
      elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
      super__Optional_payload_base<function_element_token>._M_payload._M_value.name._M_len =
           (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
      elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
      super__Optional_payload_base<function_element_token>._M_payload._M_value.name._M_str =
           (char *)(buf->buffer_ptr)._M_elems[1]._M_len;
      elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
      super__Optional_payload_base<function_element_token>._M_payload._24_8_ =
           (buf->buffer_ptr)._M_elems[1]._M_str;
      elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
      super__Optional_payload_base<function_element_token>._32_8_ =
           (buf->buffer_ptr)._M_elems[2]._M_len;
      read_bound((optional<bound_token> *)&elements,(string_view_array *)&elem);
      if ((local_150 != true) ||
         (bound._36_4_ = uStack_154, bound.read = local_158,
         bound.max = (double)elements.
                             super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
         bound.min = (double)elements.
                             super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                             ._M_impl.super__Vector_impl_data._M_start,
         bound.name._M_len =
              (size_t)elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
         bound.name._M_str = (char *)uStack_160, bVar3 = problem_parser::set_bound_variable(p,bound)
         , !bVar3)) {
        uStackY_1c0 = 8;
        goto LAB_00124e54;
      }
      stream_buffer::pop_front(buf,local_158);
    }
  }
  buf_1_07._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
  buf_1_07._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
  iVar4 = read_binary(buf_1_07,(buf->buffer_ptr)._M_elems[1]);
  if (iVar4 != 0) {
    stream_buffer::pop_front(buf,iVar4);
    uStackY_1c0 = 4;
    while (str_03._M_len = (buf->buffer_ptr)._M_elems[0]._M_len,
          str_03._M_str = (buf->buffer_ptr)._M_elems[0]._M_str, bVar3 = is_keyword(str_03), !bVar3)
    {
      value_00._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
      value_00._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
      bVar3 = problem_parser::set_boolean_variable(p,value_00);
      if (!bVar3) goto LAB_00124e54;
      stream_buffer::pop_front(buf);
    }
  }
  buf_1_08._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
  buf_1_08._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
  iVar4 = read_general(buf_1_08,(buf->buffer_ptr)._M_elems[1]);
  if (iVar4 != 0) {
    stream_buffer::pop_front(buf,iVar4);
    uStackY_1c0 = 3;
    while (str_04._M_len = (buf->buffer_ptr)._M_elems[0]._M_len,
          str_04._M_str = (buf->buffer_ptr)._M_elems[0]._M_str, bVar3 = is_keyword(str_04), !bVar3)
    {
      value_01._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
      value_01._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
      bVar3 = problem_parser::set_integer_variable(p,value_01);
      if (!bVar3) goto LAB_00124e54;
      stream_buffer::pop_front(buf);
    }
  }
  buf_1_09._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
  buf_1_09._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
  iVar4 = read_end(buf_1_09,(buf->buffer_ptr)._M_elems[1]);
  if (iVar4 == 0) {
    uStackY_1c0 = 9;
  }
  else {
    stream_buffer::pop_front(buf,iVar4);
    uStackY_1c0 = (ulong)((uint)((buf->buffer_ptr)._M_elems[0]._M_len != 0) * 2);
  }
LAB_00124e54:
  uVar12 = 0;
  rVar13.column = 0;
  rVar13.tag = (int)uStackY_1c0;
  rVar13.line = (int)(uStackY_1c0 >> 0x20);
LAB_00124e5c:
  local_188 = rVar13.column;
  rVar15._0_8_ = rVar13._0_8_ & 0xffffffff | uVar12 << 0x20;
  rVar15.column = local_188;
  return rVar15;
}

Assistant:

raw_problem_status
parse([[maybe_unused]] const baryonyx::context& ctx,
      stream_buffer& buf,
      problem_parser& p) noexcept
{
    if (auto obj_type = read_objective_type(buf.first()); !obj_type)
        return baryonyx::file_format_error_tag::bad_objective_function_type;
    else
        p.m_problem.type = *obj_type;

    buf.pop_front();

    if (auto read = try_read_objective_label(buf.first(), buf.second()); read)
        buf.pop_front(read);

    while (!is_keyword(buf.first())) {
        if (starts_with_quadratic(buf.first(), buf.second())) {
            double factor = 1.0;

            if (buf.first() == "-") {
                factor = -1.0;
                buf.pop_front();
            } else if (buf.first() == "+") {
                buf.pop_front();
            }

            if (auto ret = read_quadratic_element(buf, p, factor); !ret)
                return ret;
            continue;
        }

        if (auto elem =
              read_function_element(buf.first(), buf.second(), buf.third());
            elem) {
            if (!p.append_to_objective(*elem))
                return baryonyx::file_format_error_tag::too_many_variables;

            buf.pop_front(elem->read);
            continue;
        }

        return baryonyx::file_format_error_tag::bad_objective;
    }

    if (auto read = read_subject_to(buf.first(), buf.second(), buf.third());
        read) {
        buf.pop_front(read);
        int constraint_next_id = 0;

        while (!buf.first().empty() && !is_keyword(buf.first())) {
            std::string_view label;
            int value;
            std::vector<baryonyx::function_element> elements;

            if (starts_with_name(buf.first()) && buf.second() == ":") {
                label = p.m_problem.strings->append(buf.first());
                buf.pop_front(2);
            }

            auto elem =
              read_function_element(buf.first(), buf.second(), buf.third());
            if (!elem)
                return baryonyx::file_format_error_tag::bad_constraint;

            {
                auto id = p.get_or_assign_variable(elem->name);
                if (id == -1)
                    return baryonyx::file_format_error_tag::too_many_variables;

                auto it = std::find_if(
                  elements.begin(), elements.end(), [id](const auto& elem) {
                      return elem.variable_index == id;
                  });

                if (it == elements.end())
                    elements.emplace_back(static_cast<int>(elem->factor), id);
                else
                    it->factor += static_cast<int>(elem->factor);
            }

            buf.pop_front(elem->read);

            while (!buf.first().empty() &&
                   !starts_with_operator(buf.first())) {
                elem = read_function_element(
                  buf.first(), buf.second(), buf.third());
                if (!elem)
                    return baryonyx::file_format_error_tag::bad_constraint;

                {
                    auto id = p.get_or_assign_variable(elem->name);
                    if (id == -1)
                        return baryonyx::file_format_error_tag::
                          too_many_variables;

                    auto it =
                      std::find_if(elements.begin(),
                                   elements.end(),
                                   [id](const auto& elem) {
                                       return elem.variable_index == id;
                                   });

                    if (it == elements.end())
                        elements.emplace_back(static_cast<int>(elem->factor),
                                              id);
                    else
                        it->factor += static_cast<int>(elem->factor);
                }

                if (elements.back().variable_index == -1)
                    return baryonyx::file_format_error_tag::too_many_variables;

                buf.pop_front(elem->read);
            }

            auto operator_opt = read_operator(buf.first(), buf.second());
            if (!operator_opt)
                return baryonyx::file_format_error_tag::bad_constraint;
            buf.pop_front(operator_opt->read);

            auto value_opt = read_real(buf.first(), buf.second());
            if (!value_opt)
                return baryonyx::file_format_error_tag::bad_constraint;
            value = static_cast<int>(value_opt->value);
            buf.pop_front(value_opt->read);

            switch (operator_opt->op) {
            case baryonyx::operator_type::equal:
                p.m_problem.equal_constraints.emplace_back(
                  label, std::move(elements), value, constraint_next_id++);
                break;
            case baryonyx::operator_type::greater:
                p.m_problem.greater_constraints.emplace_back(
                  label, std::move(elements), value, constraint_next_id++);
                break;
            case baryonyx::operator_type::less:
                p.m_problem.less_constraints.emplace_back(
                  label, std::move(elements), value, constraint_next_id++);
                break;
            }
        }

        if (p.m_problem.equal_constraints.size() +
              p.m_problem.greater_constraints.size() +
              p.m_problem.less_constraints.size() >
            baryonyx::to_unsigned(INT_MAX))
            return baryonyx::file_format_error_tag::too_many_constraints;
    }

    if (auto read = read_bounds(buf.first(), buf.second()); read) {
        buf.pop_front(read);

        while (!is_keyword(buf.first())) {
            auto bound_opt = read_bound(buf.array());
            if (!bound_opt)
                return baryonyx::file_format_error_tag::bad_bound;

            if (!p.set_bound_variable(*bound_opt))
                return baryonyx::file_format_error_tag::bad_bound;

            buf.pop_front(bound_opt->read);
        }
    }

    if (auto read = read_binary(buf.first(), buf.second()); read) {
        buf.pop_front(read);

        while (!is_keyword(buf.first()))
            if (!p.set_boolean_variable(buf.first()))
                return baryonyx::file_format_error_tag::bad_binary;
            else
                buf.pop_front();
    }

    if (auto read = read_general(buf.first(), buf.second()); read) {
        buf.pop_front(read);

        while (!is_keyword(buf.first()))
            if (!p.set_integer_variable(buf.first()))
                return baryonyx::file_format_error_tag::bad_general;
            else
                buf.pop_front();
    }

    if (auto read = read_end(buf.first(), buf.second()); read) {
        buf.pop_front(read);

        return buf.first().empty()
                 ? baryonyx::file_format_error_tag::success
                 : baryonyx::file_format_error_tag::bad_end_of_file;
    }

    return baryonyx::file_format_error_tag::bad_end;
}